

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  FileDescriptor *this_00;
  long lVar4;
  string *in_RDX;
  int in_ESI;
  EnumDescriptor *in_RDI;
  int i_2;
  ReservedRange *range;
  int i_1;
  int i;
  SourceLocationCommentPrinter comment_printer;
  string prefix;
  string *in_stack_fffffffffffff0b8;
  SubstituteArg *value;
  SubstituteArg *in_stack_fffffffffffff0c0;
  SubstituteArg *this_01;
  SourceLocationCommentPrinter *this_02;
  string *in_stack_fffffffffffff0e8;
  string *in_stack_fffffffffffff0f0;
  string *in_stack_fffffffffffff0f8;
  SourceLocationCommentPrinter *in_stack_fffffffffffff100;
  string *in_stack_fffffffffffff128;
  SourceLocationCommentPrinter *in_stack_fffffffffffff130;
  SubstituteArg local_e50;
  SubstituteArg local_e20;
  SubstituteArg local_df0;
  SubstituteArg local_dc0;
  undefined1 local_d90 [96];
  SubstituteArg local_d30;
  SubstituteArg local_d00;
  SubstituteArg *in_stack_fffffffffffff338;
  SubstituteArg *in_stack_fffffffffffff340;
  SubstituteArg *in_stack_fffffffffffff348;
  SubstituteArg *in_stack_fffffffffffff350;
  string *in_stack_fffffffffffff358;
  DescriptorPool *in_stack_fffffffffffff360;
  Message *in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff370;
  int in_stack_fffffffffffff374;
  SubstituteArg *in_stack_fffffffffffff378;
  SubstituteArg *in_stack_fffffffffffff380;
  SubstituteArg *in_stack_fffffffffffff388;
  SubstituteArg *in_stack_fffffffffffff390;
  SubstituteArg *in_stack_fffffffffffff398;
  SubstituteArg local_c40;
  SubstituteArg local_c10;
  SubstituteArg local_be0;
  SubstituteArg local_bb0;
  SubstituteArg local_b80;
  SubstituteArg local_b50;
  SubstituteArg local_b20;
  SubstituteArg local_af0;
  string local_ac0 [84];
  int local_a6c;
  SubstituteArg local_a68;
  SubstituteArg local_a38;
  DebugStringOptions *in_stack_fffffffffffff5f8;
  string *in_stack_fffffffffffff600;
  int in_stack_fffffffffffff60c;
  EnumValueDescriptor *in_stack_fffffffffffff610;
  SubstituteArg local_9d8;
  SubstituteArg local_9a8;
  SubstituteArg local_978;
  SubstituteArg local_948;
  SubstituteArg local_918;
  SubstituteArg local_8e8 [2];
  SubstituteArg local_888;
  SubstituteArg local_858;
  SubstituteArg local_828;
  SubstituteArg local_7f8;
  SubstituteArg local_7c8;
  SubstituteArg local_798;
  SubstituteArg local_768;
  SubstituteArg local_738 [3];
  SubstituteArg local_6a8;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  SubstituteArg local_5b8;
  SubstituteArg local_588;
  SubstituteArg local_558;
  SubstituteArg local_528 [2];
  ReservedRange *local_4c8;
  int local_4bc;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  SubstituteArg local_3f8;
  SubstituteArg local_3c8;
  SubstituteArg local_398;
  SubstituteArg local_368;
  SubstituteArg local_338 [2];
  int local_2d4;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180 [6];
  allocator local_41;
  string local_40 [40];
  string *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(long)(in_ESI * 2),' ',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_c = local_c + 1;
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumDescriptor>
            (in_stack_fffffffffffff100,(EnumDescriptor *)in_stack_fffffffffffff0f8,
             in_stack_fffffffffffff0f0,(DebugStringOptions *)in_stack_fffffffffffff0e8);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  name_abi_cxx11_(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  strings::internal::SubstituteArg::SubstituteArg(local_180);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
  strings::internal::SubstituteArg::SubstituteArg(&local_210);
  strings::internal::SubstituteArg::SubstituteArg(&local_240);
  strings::internal::SubstituteArg::SubstituteArg(&local_270);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
  strings::internal::SubstituteArg::SubstituteArg(&local_2d0);
  this_01 = &local_210;
  value = &local_1e0;
  strings::SubstituteAndAppend
            ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
             in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
             in_stack_fffffffffffff338,
             (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
             in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
             in_stack_fffffffffffff390,in_stack_fffffffffffff398);
  options(in_RDI);
  this_00 = file(in_RDI);
  FileDescriptor::pool(this_00);
  anon_unknown_1::FormatLineOptions
            (in_stack_fffffffffffff374,in_stack_fffffffffffff368,in_stack_fffffffffffff360,
             in_stack_fffffffffffff358);
  local_2d4 = 0;
  while( true ) {
    iVar3 = local_2d4;
    iVar2 = value_count(in_RDI);
    if (iVar2 <= iVar3) break;
    EnumDescriptor::value(in_RDI,local_2d4);
    EnumValueDescriptor::DebugString
              (in_stack_fffffffffffff610,in_stack_fffffffffffff60c,in_stack_fffffffffffff600,
               in_stack_fffffffffffff5f8);
    local_2d4 = local_2d4 + 1;
  }
  iVar3 = reserved_range_count(in_RDI);
  if (0 < iVar3) {
    strings::internal::SubstituteArg::SubstituteArg(this_01,(string *)value);
    strings::internal::SubstituteArg::SubstituteArg(local_338);
    strings::internal::SubstituteArg::SubstituteArg(&local_368);
    strings::internal::SubstituteArg::SubstituteArg(&local_398);
    strings::internal::SubstituteArg::SubstituteArg(&local_3c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_3f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_428);
    strings::internal::SubstituteArg::SubstituteArg(&local_458);
    strings::internal::SubstituteArg::SubstituteArg(&local_488);
    strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
    this_01 = &local_3f8;
    value = &local_3c8;
    strings::SubstituteAndAppend
              ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
               in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
               in_stack_fffffffffffff338,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
               in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
               in_stack_fffffffffffff390,in_stack_fffffffffffff398);
    local_4bc = 0;
    while( true ) {
      iVar3 = local_4bc;
      iVar2 = reserved_range_count(in_RDI);
      psVar1 = local_18;
      if (iVar2 <= iVar3) break;
      local_4c8 = reserved_range(in_RDI,local_4bc);
      iVar3 = (int)((ulong)value >> 0x20);
      if (local_4c8->end == local_4c8->start) {
        strings::internal::SubstituteArg::SubstituteArg(this_01,iVar3);
        strings::internal::SubstituteArg::SubstituteArg(local_528);
        strings::internal::SubstituteArg::SubstituteArg(&local_558);
        strings::internal::SubstituteArg::SubstituteArg(&local_588);
        strings::internal::SubstituteArg::SubstituteArg(&local_5b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_5e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_618);
        strings::internal::SubstituteArg::SubstituteArg(&local_648);
        strings::internal::SubstituteArg::SubstituteArg(&local_678);
        strings::internal::SubstituteArg::SubstituteArg(&local_6a8);
        this_01 = &local_5e8;
        value = &local_5b8;
        strings::SubstituteAndAppend
                  ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
                   in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                   in_stack_fffffffffffff338,
                   (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                   in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
                   in_stack_fffffffffffff390,in_stack_fffffffffffff398);
      }
      else {
        strings::internal::SubstituteArg::SubstituteArg(this_01,iVar3);
        strings::internal::SubstituteArg::SubstituteArg(this_01,iVar3);
        strings::internal::SubstituteArg::SubstituteArg(local_738);
        strings::internal::SubstituteArg::SubstituteArg(&local_768);
        strings::internal::SubstituteArg::SubstituteArg(&local_798);
        strings::internal::SubstituteArg::SubstituteArg(&local_7c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_7f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_828);
        strings::internal::SubstituteArg::SubstituteArg(&local_858);
        strings::internal::SubstituteArg::SubstituteArg(&local_888);
        this_01 = &local_7c8;
        value = &local_798;
        strings::SubstituteAndAppend
                  ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
                   in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                   in_stack_fffffffffffff338,
                   (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                   in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
                   in_stack_fffffffffffff390,in_stack_fffffffffffff398);
      }
      local_4bc = local_4bc + 1;
    }
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)psVar1,lVar4 - 2,(char *)0x2);
  }
  iVar3 = reserved_name_count(in_RDI);
  if (0 < iVar3) {
    strings::internal::SubstituteArg::SubstituteArg(this_01,(string *)value);
    strings::internal::SubstituteArg::SubstituteArg(local_8e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_918);
    strings::internal::SubstituteArg::SubstituteArg(&local_948);
    strings::internal::SubstituteArg::SubstituteArg(&local_978);
    strings::internal::SubstituteArg::SubstituteArg(&local_9a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_9d8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff5f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_a38);
    strings::internal::SubstituteArg::SubstituteArg(&local_a68);
    this_01 = &local_9a8;
    value = &local_978;
    strings::SubstituteAndAppend
              ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
               in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
               in_stack_fffffffffffff338,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
               in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
               in_stack_fffffffffffff390,in_stack_fffffffffffff398);
    local_a6c = 0;
    while( true ) {
      iVar3 = local_a6c;
      iVar2 = reserved_name_count(in_RDI);
      if (iVar2 <= iVar3) break;
      in_stack_fffffffffffff0f8 = local_18;
      in_stack_fffffffffffff100 =
           (SourceLocationCommentPrinter *)reserved_name_abi_cxx11_(in_RDI,local_a6c);
      CEscape(in_stack_fffffffffffff0e8);
      strings::internal::SubstituteArg::SubstituteArg(this_01,(string *)value);
      strings::internal::SubstituteArg::SubstituteArg(&local_af0);
      strings::internal::SubstituteArg::SubstituteArg(&local_b20);
      strings::internal::SubstituteArg::SubstituteArg(&local_b50);
      strings::internal::SubstituteArg::SubstituteArg(&local_b80);
      strings::internal::SubstituteArg::SubstituteArg(&local_bb0);
      strings::internal::SubstituteArg::SubstituteArg(&local_be0);
      strings::internal::SubstituteArg::SubstituteArg(&local_c10);
      strings::internal::SubstituteArg::SubstituteArg(&local_c40);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff390);
      this_01 = &local_bb0;
      value = &local_b80;
      strings::SubstituteAndAppend
                ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
                 in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                 in_stack_fffffffffffff338,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                 in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
                 in_stack_fffffffffffff390,in_stack_fffffffffffff398);
      std::__cxx11::string::~string(local_ac0);
      local_a6c = local_a6c + 1;
    }
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)local_18,lVar4 - 2,(char *)0x2);
  }
  strings::internal::SubstituteArg::SubstituteArg(this_01,(string *)value);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff330);
  strings::internal::SubstituteArg::SubstituteArg(&local_d00);
  strings::internal::SubstituteArg::SubstituteArg(&local_d30);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_d90 + 0x30));
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_d90);
  strings::internal::SubstituteArg::SubstituteArg(&local_dc0);
  strings::internal::SubstituteArg::SubstituteArg(&local_df0);
  strings::internal::SubstituteArg::SubstituteArg(&local_e20);
  strings::internal::SubstituteArg::SubstituteArg(&local_e50);
  this_02 = (SourceLocationCommentPrinter *)local_d90;
  strings::SubstituteAndAppend
            ((string *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358,
             in_stack_fffffffffffff350,in_stack_fffffffffffff348,in_stack_fffffffffffff340,
             in_stack_fffffffffffff338,
             (SubstituteArg *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
             in_stack_fffffffffffff378,in_stack_fffffffffffff380,in_stack_fffffffffffff388,
             in_stack_fffffffffffff390,in_stack_fffffffffffff398);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_02);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n", prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                     range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                   CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}